

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

string * __thiscall
pbrt::TransformedSceneEntity::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TransformedSceneEntity *this)

{
  AnimatedTransform *unaff_RBX;
  
  StringPrintf<std::__cxx11::string_const&,pbrt::ParameterDictionary_const&,pbrt::FileLoc_const&,pbrt::AnimatedTransform_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ TransformedSeneEntity name: %s parameters: %s loc: %s renderFromObject: %s ]",
             (char *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->super_SceneEntity).parameters,
             (ParameterDictionary *)&(this->super_SceneEntity).loc,
             (FileLoc *)&this->renderFromObject,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ TransformedSeneEntity name: %s parameters: %s loc: %s "
                            "renderFromObject: %s ]",
                            name, parameters, loc, renderFromObject);
    }